

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O0

bool __thiscall
cmArchiveWrite::Add(cmArchiveWrite *this,string *path,size_t skip,char *prefix,bool recursive)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  long lVar4;
  bool recursive_local;
  char *prefix_local;
  size_t skip_local;
  string *path_local;
  cmArchiveWrite *this_local;
  
  bVar1 = Okay(this);
  if (bVar1) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::__cxx11::string::size();
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)path);
      if (*pcVar3 == '/') {
        lVar4 = std::__cxx11::string::size();
        std::__cxx11::string::erase((ulong)path,lVar4 - 1);
      }
    }
    pcVar3 = (char *)std::__cxx11::string::c_str();
    AddPath(this,pcVar3,skip,prefix,recursive);
  }
  bVar1 = Okay(this);
  return bVar1;
}

Assistant:

bool cmArchiveWrite::Add(std::string path, size_t skip, const char* prefix,
                         bool recursive)
{
  if (this->Okay()) {
    if (!path.empty() && path[path.size() - 1] == '/') {
      path.erase(path.size() - 1);
    }
    this->AddPath(path.c_str(), skip, prefix, recursive);
  }
  return this->Okay();
}